

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_xz.c
# Opt level: O0

int common_setup(archive_write_filter *f)

{
  archive *a_00;
  undefined4 *puVar1;
  archive_write *a;
  private_data_conflict7 *data;
  archive_write_filter *f_local;
  
  a_00 = f->archive;
  puVar1 = (undefined4 *)calloc(1,0x148);
  if (puVar1 == (undefined4 *)0x0) {
    archive_set_error(a_00,0xc,"Out of memory");
    f_local._4_4_ = -0x1e;
  }
  else {
    f->data = puVar1;
    *puVar1 = 6;
    puVar1[1] = 1;
    f->open = archive_compressor_xz_open;
    f->close = archive_compressor_xz_close;
    f->free = archive_compressor_xz_free;
    f->options = archive_compressor_xz_options;
    f_local._4_4_ = 0;
  }
  return f_local._4_4_;
}

Assistant:

static int
common_setup(struct archive_write_filter *f)
{
	struct private_data *data;
	struct archive_write *a = (struct archive_write *)f->archive;
	data = calloc(1, sizeof(*data));
	if (data == NULL) {
		archive_set_error(&a->archive, ENOMEM, "Out of memory");
		return (ARCHIVE_FATAL);
	}
	f->data = data;
	data->compression_level = LZMA_PRESET_DEFAULT;
	data->threads = 1;
	f->open = &archive_compressor_xz_open;
	f->close = archive_compressor_xz_close;
	f->free = archive_compressor_xz_free;
	f->options = &archive_compressor_xz_options;
	return (ARCHIVE_OK);
}